

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  
  switch(data_type) {
  case 0:
    bVar1 = SliderBehaviorT<int,int,float>
                      (bb,id,0,(int *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 1:
    bVar1 = SliderBehaviorT<unsigned_int,int,float>
                      (bb,id,1,(uint *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 2:
    bVar1 = SliderBehaviorT<long_long,long_long,double>
                      (bb,id,2,(longlong *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 3:
    bVar1 = SliderBehaviorT<unsigned_long_long,long_long,double>
                      (bb,id,3,(unsigned_long_long *)v,*v_min,*v_max,format,power,flags,out_grab_bb)
    ;
    return bVar1;
  case 4:
    bVar1 = SliderBehaviorT<float,float,float>
                      (bb,id,4,(float *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 5:
    bVar1 = SliderBehaviorT<double,double,double>
                      (bb,id,5,(double *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    switch (data_type)
    {
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)v,  *(const ImS32*)v_min,  *(const ImS32*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)v_min <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)v,  *(const ImU32*)v_min,  *(const ImU32*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)v,  *(const ImS64*)v_min,  *(const ImS64*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)v_min <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)v,  *(const ImU64*)v_min,  *(const ImU64*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)v_min >= -FLT_MAX/2.0f && *(const float*)v_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)v,  *(const float*)v_min,  *(const float*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)v_min >= -DBL_MAX/2.0f && *(const double*)v_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)v, *(const double*)v_min, *(const double*)v_max, format, power, flags, out_grab_bb);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}